

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O3

void testing::internal::TuplePrefix<3ul>::
     ExplainMatchFailuresTo<std::tuple<testing::Matcher<mp::expr::Kind>,testing::Matcher<BasicTestExpr<1>>,testing::Matcher<BasicTestExpr<1>>>,std::tuple<mp::expr::Kind,BasicTestExpr<1>,BasicTestExpr<1>>>
               (tuple<testing::Matcher<mp::expr::Kind>,_testing::Matcher<BasicTestExpr<1>_>,_testing::Matcher<BasicTestExpr<1>_>_>
                *matchers,tuple<mp::expr::Kind,_BasicTestExpr<1>,_BasicTestExpr<1>_> *values,
               ostream *os)

{
  _Head_base<2UL,_BasicTestExpr<1>,_false> _Var1;
  MatcherInterface<BasicTestExpr<1>_> *pMVar2;
  linked_ptr_internal lVar3;
  char cVar4;
  int iVar5;
  ostream *poVar6;
  Value value;
  type matcher;
  StringMatchResultListener listener;
  _Head_base<2UL,_BasicTestExpr<1>,_false> local_204;
  long *local_200;
  long local_1f8;
  long local_1f0 [2];
  undefined **local_1e0;
  linked_ptr<const_testing::MatcherInterface<BasicTestExpr<1>_>_> local_1d8;
  undefined **local_1c8;
  undefined1 *local_1c0;
  stringstream local_1b8 [16];
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  TuplePrefix<2ul>::
  ExplainMatchFailuresTo<std::tuple<testing::Matcher<mp::expr::Kind>,testing::Matcher<BasicTestExpr<1>>,testing::Matcher<BasicTestExpr<1>>>,std::tuple<mp::expr::Kind,BasicTestExpr<1>,BasicTestExpr<1>>>
            (matchers,values,os);
  local_1e0 = &PTR__MatcherBase_0028b2a0;
  local_1d8.value_ =
       (matchers->
       super__Tuple_impl<0UL,_testing::Matcher<mp::expr::Kind>,_testing::Matcher<BasicTestExpr<1>_>,_testing::Matcher<BasicTestExpr<1>_>_>
       ).
       super__Tuple_impl<1UL,_testing::Matcher<BasicTestExpr<1>_>,_testing::Matcher<BasicTestExpr<1>_>_>
       .super__Tuple_impl<2UL,_testing::Matcher<BasicTestExpr<1>_>_>.
       super__Head_base<2UL,_testing::Matcher<BasicTestExpr<1>_>,_false>._M_head_impl.
       super_MatcherBase<BasicTestExpr<1>_>.impl_.value_;
  lVar3.next_ = &local_1d8.link_;
  if (local_1d8.value_ != (MatcherInterface<BasicTestExpr<1>_> *)0x0) {
    linked_ptr_internal::join
              (&local_1d8.link_,
               (linked_ptr_internal *)
               ((long)&(matchers->
                       super__Tuple_impl<0UL,_testing::Matcher<mp::expr::Kind>,_testing::Matcher<BasicTestExpr<1>_>,_testing::Matcher<BasicTestExpr<1>_>_>
                       ).
                       super__Tuple_impl<1UL,_testing::Matcher<BasicTestExpr<1>_>,_testing::Matcher<BasicTestExpr<1>_>_>
                       .super__Tuple_impl<2UL,_testing::Matcher<BasicTestExpr<1>_>_>.
                       super__Head_base<2UL,_testing::Matcher<BasicTestExpr<1>_>,_false>.
                       _M_head_impl.super_MatcherBase<BasicTestExpr<1>_>.impl_ + 8));
    lVar3.next_ = local_1d8.link_.next_;
  }
  local_1d8.link_.next_ = lVar3.next_;
  local_1e0 = &PTR__MatcherBase_0028b258;
  _Var1 = (values->super__Tuple_impl<0UL,_mp::expr::Kind,_BasicTestExpr<1>,_BasicTestExpr<1>_>).
          super__Tuple_impl<1UL,_BasicTestExpr<1>,_BasicTestExpr<1>_>.
          super__Tuple_impl<2UL,_BasicTestExpr<1>_>.super__Head_base<2UL,_BasicTestExpr<1>,_false>;
  local_1c0 = local_1a8;
  local_1c8 = &PTR__StringMatchResultListener_00288348;
  local_204 = _Var1;
  std::__cxx11::stringstream::stringstream(local_1b8);
  cVar4 = (**(code **)(*(long *)local_1d8.value_ + 0x20))(local_1d8.value_,_Var1,&local_1c8);
  if (cVar4 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>(os,"  Expected arg #",0x10);
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)os);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,": ",2);
    pMVar2 = (matchers->
             super__Tuple_impl<0UL,_testing::Matcher<mp::expr::Kind>,_testing::Matcher<BasicTestExpr<1>_>,_testing::Matcher<BasicTestExpr<1>_>_>
             ).
             super__Tuple_impl<1UL,_testing::Matcher<BasicTestExpr<1>_>,_testing::Matcher<BasicTestExpr<1>_>_>
             .super__Tuple_impl<2UL,_testing::Matcher<BasicTestExpr<1>_>_>.
             super__Head_base<2UL,_testing::Matcher<BasicTestExpr<1>_>,_false>._M_head_impl.
             super_MatcherBase<BasicTestExpr<1>_>.impl_.value_;
    (**(code **)(*(long *)pMVar2 + 0x10))(pMVar2,os);
    std::__ostream_insert<char,std::char_traits<char>>(os,"\n           Actual: ",0x14);
    internal2::PrintBytesInObjectTo((uchar *)&local_204,4,os);
    std::__cxx11::stringbuf::str();
    iVar5 = std::__cxx11::string::compare((char *)&local_200);
    if ((os != (ostream *)0x0) && (iVar5 != 0)) {
      std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_200,local_1f8);
    }
    if (local_200 != local_1f0) {
      operator_delete(local_200,local_1f0[0] + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
  }
  local_1c8 = &PTR__StringMatchResultListener_00288348;
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  local_1e0 = &PTR__MatcherBase_0028b2a0;
  linked_ptr<const_testing::MatcherInterface<BasicTestExpr<1>_>_>::~linked_ptr(&local_1d8);
  return;
}

Assistant:

static void ExplainMatchFailuresTo(const MatcherTuple& matchers,
                                     const ValueTuple& values,
                                     ::std::ostream* os) {
    using ::std::tr1::tuple_element;
    using ::std::tr1::get;

    // First, describes failures in the first N - 1 fields.
    TuplePrefix<N - 1>::ExplainMatchFailuresTo(matchers, values, os);

    // Then describes the failure (if any) in the (N - 1)-th (0-based)
    // field.
    typename tuple_element<N - 1, MatcherTuple>::type matcher =
        get<N - 1>(matchers);
    typedef typename tuple_element<N - 1, ValueTuple>::type Value;
    Value value = get<N - 1>(values);
    StringMatchResultListener listener;
    if (!matcher.MatchAndExplain(value, &listener)) {
      // TODO(wan): include in the message the name of the parameter
      // as used in MOCK_METHOD*() when possible.
      *os << "  Expected arg #" << N - 1 << ": ";
      get<N - 1>(matchers).DescribeTo(os);
      *os << "\n           Actual: ";
      // We remove the reference in type Value to prevent the
      // universal printer from printing the address of value, which
      // isn't interesting to the user most of the time.  The
      // matcher's MatchAndExplain() method handles the case when
      // the address is interesting.
      internal::UniversalPrint(value, os);
      PrintIfNotEmpty(listener.str(), os);
      *os << "\n";
    }
  }